

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionRayleighAdvancedGeneric::GetMainInertiasInMassReference
          (ChBeamSectionRayleighAdvancedGeneric *this,double *Jmyy,double *Jmzz,double *phi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  dVar4 = (this->super_ChBeamSectionEulerAdvancedGeneric).Mz;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar4;
  dVar11 = (this->super_ChBeamSectionEulerAdvancedGeneric).mu;
  dVar5 = (this->super_ChBeamSectionEulerAdvancedGeneric).My;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->Jyy;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar11 * dVar4;
  auVar1 = vfnmadd213sd_fma(auVar10,auVar7,auVar1);
  dVar9 = auVar1._0_8_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->Jzz;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar5 * dVar11;
  auVar2 = vfnmadd213sd_fma(auVar12,auVar14,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->Jyz;
  auVar1 = vfmsub213sd_fma(auVar14,auVar7,auVar3);
  dVar11 = auVar2._0_8_;
  dVar4 = (dVar9 - dVar11) * 0.5;
  dVar5 = auVar1._0_8_;
  dVar4 = dVar5 * dVar5 + dVar4 * dVar4;
  if (dVar4 <= 0.0) {
    *phi = 0.0;
    dVar4 = (dVar9 + dVar11) * 0.5;
    *Jmyy = dVar4;
  }
  else {
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar4;
      auVar1 = vsqrtsd_avx(auVar6,auVar6);
      dVar4 = auVar1._0_8_;
    }
    dVar5 = atan2(dVar5 / dVar4,(dVar11 - dVar9) / (dVar4 + dVar4));
    *phi = dVar5 * -0.5;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar4;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar11 + dVar9;
    auVar1 = vfmsub213sd_fma(ZEXT816(0x3fe0000000000000),auVar8,auVar13);
    *Jmyy = auVar1._0_8_;
    auVar1 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar8,auVar13);
    dVar4 = auVar1._0_8_;
  }
  *Jmzz = dVar4;
  return;
}

Assistant:

void ChBeamSectionRayleighAdvancedGeneric::GetMainInertiasInMassReference(double& Jmyy, double& Jmzz, double& phi) {
		// remove inertia transport
		double Tyy_rot  =  this->Jyy - this->mu * this->Mz * this->Mz;
		double Tzz_rot  =  this->Jzz - this->mu * this->My * this->My;
		double Tyz_rot  = -this->Jyz + this->mu * this->Mz * this->My;
		// tensor de-rotation up to principal axes
		double argum = pow((Tyy_rot - Tzz_rot) * 0.5, 2) + pow(Tyz_rot, 2);
		if (argum <= 0) {
			phi = 0;
			Jmyy = 0.5 * (Tzz_rot + Tyy_rot);
			Jmzz = 0.5 * (Tzz_rot + Tyy_rot);
			return;
		}
		double discr = sqrt( pow((Tyy_rot - Tzz_rot)*0.5,2) + pow(Tyz_rot, 2) );
		phi = - 0.5* atan2(Tyz_rot / discr, (Tzz_rot - Tyy_rot) / (2. * discr));
		Jmyy = 0.5 * (Tzz_rot + Tyy_rot) - discr;
		Jmzz = 0.5 * (Tzz_rot + Tyy_rot) + discr;
	}